

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_declaration_statement(gravity_parser_t *parser)

{
  gnode_n gVar1;
  gliteral_t gVar2;
  gravity_lexer_t *pgVar3;
  gravity_lexer_t *lexer;
  long *plVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  bool bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  _Bool _Var22;
  _Bool _Var23;
  gtoken_t gVar24;
  gtoken_t access_specifier;
  gtoken_t storage_specifier;
  gtoken_t gVar25;
  uint32_t uVar26;
  gnode_t *pgVar27;
  char *pcVar28;
  symboltable_t *symtable;
  gnode_r *pgVar29;
  gnode_t **ppgVar30;
  gnode_t *pgVar31;
  gnode_r *pgVar32;
  gnode_r *declarations;
  char *pcVar33;
  gtoken_s *pgVar34;
  gnode_t *pgVar35;
  gliteral_t gVar36;
  size_t sVar37;
  gnode_t *pgVar38;
  size_t sVar39;
  int iVar40;
  gnode_variable_decl_t *vdec_node;
  gliteral_t local_164;
  long local_158;
  gnode_t *local_150;
  gtoken_s enum_token;
  gtoken_s token;
  
  pgVar3 = parser->lexer->p[parser->lexer->n - 1];
  gVar24 = gravity_lexer_peek(pgVar3);
  _Var22 = token_isaccess_specifier(gVar24);
  storage_specifier = TOK_EOF;
  access_specifier = TOK_EOF;
  if (_Var22) {
    access_specifier = gravity_lexer_next(pgVar3);
    gVar24 = gravity_lexer_peek(pgVar3);
  }
  _Var22 = token_isstorage_specifier(gVar24);
  if (_Var22) {
    storage_specifier = gravity_lexer_next(pgVar3);
    gVar24 = gravity_lexer_peek(pgVar3);
  }
  switch(gVar24) {
  case TOK_KEY_ENUM:
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_next(pgVar3);
    gravity_lexer_token(pgVar3);
    if (gVar24 != TOK_KEY_ENUM) {
      __assert_fail("type == TOK_KEY_ENUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x599,"gnode_t *parse_enum_declaration(gravity_parser_t *, gtoken_t, gtoken_t)"
                   );
    }
    pcVar28 = parse_identifier(parser);
    _Var22 = parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
    if (!_Var22) {
      return (gnode_t *)0x0;
    }
    symtable = symboltable_create(SYMTABLE_TAG_ENUM);
    sVar37 = parser->declarations->n;
    if (sVar37 == 0) {
      pgVar27 = (gnode_t *)0x0;
    }
    else {
      pgVar27 = parser->declarations->p[sVar37 - 1];
    }
    token_01.lineno = token.lineno;
    token_01.type = token.type;
    token_01.colno = token.colno;
    token_01.position = token.position;
    token_01.bytes = token.bytes;
    token_01.length = token.length;
    token_01.fileid = token.fileid;
    token_01.builtin = token.builtin;
    token_01.value = token.value;
    pgVar27 = gnode_enum_decl_create
                        (token_01,pcVar28,access_specifier,storage_specifier,symtable,pgVar27);
    local_164 = LITERAL_INT;
    iVar40 = 0;
    local_158 = 0;
LAB_0010f90c:
    do {
      gVar24 = gravity_lexer_peek(pgVar3);
      if (gVar24 == TOK_OP_CLOSED_CURLYBRACE) goto LAB_0010fde9;
      gVar24 = gravity_lexer_peek(pgVar3);
      if (gVar24 == TOK_IDENTIFIER) {
        local_150 = (gnode_t *)parse_identifier(parser);
        gravity_lexer_token(pgVar3);
        if (local_150 == (gnode_t *)0x0) goto LAB_0010f972;
        bVar15 = false;
      }
      else {
LAB_0010f972:
        pcVar33 = token_name(gVar24);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x13de08,pcVar33);
        bVar15 = true;
        local_150 = (gnode_t *)0x0;
      }
      gVar24 = gravity_lexer_peek(pgVar3);
      gravity_lexer_token(pgVar3);
      _Var22 = token_isvariable_assignment(gVar24);
      if (((!_Var22) && (gVar24 != TOK_OP_COMMA)) && (gVar24 != TOK_OP_CLOSED_CURLYBRACE)) {
        pcVar33 = token_name(gVar24);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x13de2d,pcVar33);
      }
      _Var22 = token_isvariable_assignment(gVar24);
      if ((!_Var22) && (local_164 != LITERAL_INT)) {
        pcVar33 = token_name(gVar24);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x13de48,pcVar33);
      }
      _Var22 = token_isvariable_assignment(gVar24);
      if (_Var22) {
        gravity_lexer_next(pgVar3);
        pgVar31 = parse_expression(parser);
        if (pgVar31 == (gnode_t *)0x0) goto LAB_0010fb29;
        pgVar38 = pgVar31;
        if (pgVar31->tag != NODE_LITERAL_EXPR) {
          if ((pgVar31->tag == NODE_UNARY_EXPR) &&
             (pgVar38 = *(gnode_t **)&pgVar31[1].block_length, pgVar38->tag == NODE_LITERAL_EXPR)) {
            if ((pgVar31[1].tag & ~NODE_COMPOUND_STAT) == 0x32) {
              if (pgVar38[1].tag - NODE_COMPOUND_STAT < 2) {
                if (pgVar31[1].tag == 0x33) {
                  pgVar34 = &pgVar31->token;
                  pgVar29 = parser->declarations;
                  sVar37 = pgVar29->n;
                  if (pgVar38[1].tag == NODE_COMPOUND_STAT) {
                    if (sVar37 == 0) {
                      pgVar35 = (gnode_t *)0x0;
                    }
                    else {
                      pgVar35 = pgVar29->p[sVar37 - 1];
                    }
                    uVar10 = (pgVar31->token).position;
                    uVar19 = pgVar34->type;
                    uVar20 = pgVar34->lineno;
                    uVar21 = pgVar34->colno;
                    token_03.colno = uVar21;
                    token_03.lineno = uVar20;
                    token_03.type = uVar19;
                    uVar11 = (pgVar31->token).bytes;
                    uVar12 = (pgVar31->token).length;
                    uVar13 = (pgVar31->token).fileid;
                    uVar14 = (pgVar31->token).builtin;
                    token_03.position = uVar10;
                    token_03.bytes = uVar11;
                    token_03.length = uVar12;
                    token_03.fileid = uVar13;
                    token_03.builtin = uVar14;
                    token_03.value = (pgVar31->token).value;
                    pgVar35 = gnode_literal_float_expr_create
                                        (token_03,-*(double *)&pgVar38[1].block_length,pgVar35);
                  }
                  else {
                    pgVar35 = (gnode_t *)0x0;
                    if (sVar37 != 0) {
                      pgVar35 = pgVar29->p[sVar37 - 1];
                    }
                    uVar5 = (pgVar31->token).position;
                    uVar16 = pgVar34->type;
                    uVar17 = pgVar34->lineno;
                    uVar18 = pgVar34->colno;
                    token_02.colno = uVar18;
                    token_02.lineno = uVar17;
                    token_02.type = uVar16;
                    uVar6 = (pgVar31->token).bytes;
                    uVar7 = (pgVar31->token).length;
                    uVar8 = (pgVar31->token).fileid;
                    uVar9 = (pgVar31->token).builtin;
                    token_02.position = uVar5;
                    token_02.bytes = uVar6;
                    token_02.length = uVar7;
                    token_02.fileid = uVar8;
                    token_02.builtin = uVar9;
                    token_02.value = (pgVar31->token).value;
                    pgVar35 = gnode_literal_int_expr_create
                                        (token_02,-*(long *)&pgVar38[1].block_length,pgVar35);
                  }
                  if (pgVar35 != (gnode_t *)0x0) {
                    gnode_free(pgVar31);
                    pgVar38 = pgVar35;
                    pgVar31 = pgVar35;
                  }
                }
                goto LAB_0010fc67;
              }
              pcVar33 = 
              "A number is expected after a + or - unary expression in an enum definition.";
            }
            else {
              pcVar33 = "Only + or - allowed in enum value definition.";
            }
          }
          else {
            pcVar33 = "Literal value expected here.";
          }
          report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar33);
          goto LAB_0010f90c;
        }
LAB_0010fc67:
        gVar2 = pgVar38[1].tag;
        if (((iVar40 != 0) || (LITERAL_BOOL < gVar2)) || (gVar2 == LITERAL_INT)) {
          gVar36 = local_164;
          if (gVar2 != local_164) {
            pcVar33 = token_literal_name(local_164);
            report_error(parser,GRAVITY_ERROR_SYNTAX,0x13df0c,pcVar33);
            gVar36 = pgVar38[1].tag;
          }
          gVar2 = local_164;
          if (gVar36 == LITERAL_INT) {
            local_158 = *(long *)&pgVar38[1].block_length + 1;
          }
        }
      }
      else {
LAB_0010fb29:
        sVar37 = parser->declarations->n;
        if (sVar37 == 0) {
          pgVar31 = (gnode_t *)0x0;
        }
        else {
          pgVar31 = parser->declarations->p[sVar37 - 1];
        }
        pgVar31 = gnode_literal_int_expr_create((gtoken_s)ZEXT840(0),local_158,pgVar31);
        local_158 = local_158 + 1;
        gVar2 = local_164;
      }
      local_164 = gVar2;
      if (!bVar15) {
        _Var22 = symboltable_insert(symtable,(char *)local_150,pgVar31);
        if (!_Var22) {
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x13df34,(char *)local_150);
          gnode_free(pgVar31);
        }
        free(local_150);
      }
      iVar40 = iVar40 + 1;
      gVar24 = gravity_lexer_peek(pgVar3);
      if (gVar24 != TOK_OP_COMMA) goto LAB_0010fde9;
      gravity_lexer_next(pgVar3);
    } while( true );
  case TOK_KEY_CLASS:
  case TOK_KEY_STRUCT:
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_next(pgVar3);
    gravity_lexer_token(pgVar3);
    pcVar28 = parse_identifier(parser);
    gVar25 = gravity_lexer_peek(pgVar3);
    if (gVar25 == TOK_OP_COLON) {
      gravity_lexer_next(pgVar3);
      local_150 = parse_id(parser);
    }
    else {
      local_150 = (gnode_t *)0x0;
    }
    gVar25 = gravity_lexer_peek(pgVar3);
    if (gVar25 == TOK_OP_LESS) {
      gravity_lexer_next(pgVar3);
      lexer = parser->lexer->p[parser->lexer->n - 1];
      gVar25 = gravity_lexer_peek(lexer);
      if (gVar25 == TOK_OP_GREATER) {
        pgVar29 = (gnode_r *)0x0;
      }
      else {
        pgVar29 = gnode_array_create();
        while (_Var22 = token_isidentifier(gVar25), _Var22) {
          pgVar27 = parse_id(parser);
          if (pgVar27 != (gnode_t *)0x0) {
            sVar37 = pgVar29->n;
            ppgVar30 = pgVar29->p;
            if (sVar37 == pgVar29->m) {
              sVar39 = sVar37 * 2;
              if (sVar37 == 0) {
                sVar39 = 8;
              }
              pgVar29->m = sVar39;
              ppgVar30 = (gnode_t **)realloc(ppgVar30,sVar39 << 3);
              pgVar29->p = ppgVar30;
              sVar37 = pgVar29->n;
            }
            pgVar29->n = sVar37 + 1;
            ppgVar30[sVar37] = pgVar27;
          }
          gVar25 = gravity_lexer_peek(lexer);
          if (gVar25 != TOK_OP_COMMA) goto LAB_0010f46e;
          gravity_lexer_next(lexer);
          gVar25 = TOK_OP_COMMA;
        }
        if (pgVar29 != (gnode_r *)0x0) {
          free(pgVar29->p);
          free(pgVar29);
        }
        pgVar29 = (gnode_r *)0x0;
      }
LAB_0010f46e:
      parse_required(parser,TOK_OP_GREATER);
    }
    else {
      pgVar29 = (gnode_r *)0x0;
    }
    if (storage_specifier != TOK_KEY_EXTERN) {
      parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
    }
    pgVar32 = gnode_array_create();
    pgVar27 = get_enclosing(parser,NODE_CLASS_DECL);
    if (pgVar27 != (gnode_t *)0x0) {
      declarations = gnode_array_create();
      pcVar33 = string_dup("outer");
      sVar37 = parser->declarations->n;
      if (sVar37 == 0) {
        pgVar27 = (gnode_t *)0x0;
      }
      else {
        pgVar27 = parser->declarations->p[sVar37 - 1];
      }
      pgVar27 = gnode_variable_create
                          ((gtoken_s)ZEXT840(0),pcVar33,(char *)0x0,(gnode_t *)0x0,pgVar27,
                           (gnode_variable_decl_t *)0x0);
      sVar37 = declarations->n;
      if (sVar37 == declarations->m) {
        sVar39 = sVar37 * 2;
        if (sVar37 == 0) {
          sVar39 = 8;
        }
        declarations->m = sVar39;
        ppgVar30 = (gnode_t **)realloc(declarations->p,sVar39 << 3);
        declarations->p = ppgVar30;
        sVar37 = declarations->n;
      }
      else {
        ppgVar30 = declarations->p;
      }
      declarations->n = sVar37 + 1;
      ppgVar30[sVar37] = pgVar27;
      sVar37 = parser->declarations->n;
      if (sVar37 == 0) {
        pgVar27 = (gnode_t *)0x0;
      }
      else {
        pgVar27 = parser->declarations->p[sVar37 - 1];
      }
      pgVar27 = gnode_variable_decl_create
                          ((gtoken_s)ZEXT840(0),TOK_KEY_VAR,TOK_KEY_PRIVATE,TOK_EOF,declarations,
                           pgVar27);
      sVar37 = pgVar32->n;
      if (sVar37 == pgVar32->m) {
        sVar39 = sVar37 * 2;
        if (sVar37 == 0) {
          sVar39 = 8;
        }
        pgVar32->m = sVar39;
        ppgVar30 = (gnode_t **)realloc(pgVar32->p,sVar39 << 3);
        pgVar32->p = ppgVar30;
        sVar37 = pgVar32->n;
      }
      else {
        ppgVar30 = pgVar32->p;
      }
      pgVar32->n = sVar37 + 1;
      ppgVar30[sVar37] = pgVar27;
    }
    sVar37 = parser->declarations->n;
    if (sVar37 == 0) {
      pgVar27 = (gnode_t *)0x0;
    }
    else {
      pgVar27 = parser->declarations->p[sVar37 - 1];
    }
    token_00.lineno = token.lineno;
    token_00.type = token.type;
    token_00.colno = token.colno;
    token_00.position = token.position;
    token_00.bytes = token.bytes;
    token_00.length = token.length;
    token_00.fileid = token.fileid;
    token_00.builtin = token.builtin;
    token_00.value = token.value;
    pgVar27 = gnode_class_decl_create
                        (token_00,pcVar28,access_specifier,storage_specifier,local_150,pgVar29,
                         (gnode_r *)0x0,gVar24 == TOK_KEY_STRUCT,pgVar27);
    if (storage_specifier != TOK_KEY_EXTERN) {
      pgVar29 = parser->declarations;
      sVar37 = pgVar29->n;
      if (sVar37 == pgVar29->m) {
        sVar39 = sVar37 * 2;
        if (sVar37 == 0) {
          sVar39 = 8;
        }
        pgVar29->m = sVar39;
        ppgVar30 = (gnode_t **)realloc(pgVar29->p,sVar39 << 3);
        pgVar29 = parser->declarations;
        pgVar29->p = ppgVar30;
        sVar37 = pgVar29->n;
      }
      else {
        ppgVar30 = pgVar29->p;
      }
      pgVar29->n = sVar37 + 1;
      ppgVar30[sVar37] = pgVar27;
      gVar24 = gravity_lexer_peek(pgVar3);
      while ((_Var22 = token_isdeclaration_statement(gVar24), _Var22 ||
             (_Var22 = token_ismacro(gVar24), _Var22))) {
        pgVar31 = parse_declaration_statement(parser);
        if (pgVar31 != (gnode_t *)0x0) {
          sVar37 = pgVar32->n;
          if (sVar37 == pgVar32->m) {
            sVar39 = sVar37 * 2;
            if (sVar37 == 0) {
              sVar39 = 8;
            }
            pgVar32->m = sVar39;
            ppgVar30 = (gnode_t **)realloc(pgVar32->p,sVar39 << 3);
            pgVar32->p = ppgVar30;
          }
          gVar1 = pgVar31->tag;
          if (gVar1 == NODE_FUNCTION_DECL) {
            pcVar33 = *(char **)&pgVar31[1].token.colno;
            if ((pcVar33 != (char *)0x0) && (pgVar31[1].block_length == 0)) {
              pgVar31[1].block_length = (uint)(*pcVar33 != '_') * 3 + 0x1a;
            }
          }
          else if (gVar1 == NODE_CLASS_DECL) {
            pcVar33 = *(char **)&pgVar31[1].token.colno;
            if ((pcVar33 != (char *)0x0) && (pgVar31[1].token.type == TOK_EOF)) {
              pgVar31[1].token.type = (uint)(*pcVar33 != '_') * 3 + TOK_KEY_PRIVATE;
            }
          }
          else if ((gVar1 == NODE_VARIABLE_DECL) && (pgVar31[1].refcount == 0)) {
            plVar4 = *(long **)&pgVar31[1].token;
            uVar26 = 0x1d;
            if ((plVar4 != (long *)0x0) &&
               ((*plVar4 != 0 && (*(char **)(*(long *)plVar4[2] + 0x50) != (char *)0x0)))) {
              uVar26 = (uint)(**(char **)(*(long *)plVar4[2] + 0x50) != '_') * 3 + 0x1a;
            }
            pgVar31[1].refcount = uVar26;
          }
          sVar37 = pgVar32->n;
          pgVar32->n = sVar37 + 1;
          pgVar32->p[sVar37] = pgVar31;
        }
        gVar24 = gravity_lexer_peek(pgVar3);
      }
      parser->declarations->n = parser->declarations->n - 1;
      parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    }
    parse_semicolon(parser);
    *(gnode_r **)&pgVar27[1].is_assignment = pgVar32;
    pgVar31 = get_enclosing(parser,NODE_FUNCTION_DECL);
    if (pgVar31 == (gnode_t *)0x0) {
      return pgVar27;
    }
    pcVar33 = string_dup(gravity_class_class->identifier);
    goto LAB_0010f884;
  case TOK_KEY_CONST:
  case TOK_KEY_VAR:
    pgVar27 = parse_variable_declaration(parser,true,access_specifier,storage_specifier);
    return pgVar27;
  case TOK_KEY_MODULE:
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_next(pgVar3);
    gravity_lexer_token(pgVar3);
    if (gVar24 != TOK_KEY_MODULE) {
      __assert_fail("type == TOK_KEY_MODULE",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x641,
                    "gnode_t *parse_module_declaration(gravity_parser_t *, gtoken_t, gtoken_t)");
    }
    parse_identifier(parser);
    _Var22 = parse_optional(parser,TOK_OP_OPEN_CURLYBRACE);
    pgVar29 = gnode_array_create();
    while( true ) {
      gVar24 = gravity_lexer_peek(pgVar3);
      _Var23 = token_isdeclaration_statement(gVar24);
      if (!_Var23) break;
      pgVar27 = parse_declaration_statement(parser);
      if (pgVar27 != (gnode_t *)0x0) {
        sVar37 = pgVar29->n;
        ppgVar30 = pgVar29->p;
        if (sVar37 == pgVar29->m) {
          sVar39 = sVar37 * 2;
          if (sVar37 == 0) {
            sVar39 = 8;
          }
          pgVar29->m = sVar39;
          ppgVar30 = (gnode_t **)realloc(ppgVar30,sVar39 << 3);
          pgVar29->p = ppgVar30;
          sVar37 = pgVar29->n;
        }
        pgVar29->n = sVar37 + 1;
        ppgVar30[sVar37] = pgVar27;
      }
    }
    if (_Var22) {
      parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    }
    parse_semicolon(parser);
    pcVar28 = "Module declarations not yet supported.";
    break;
  case TOK_KEY_EVENT:
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_next(pgVar3);
    gravity_lexer_token(pgVar3);
    if (gVar24 != TOK_KEY_EVENT) {
      __assert_fail("type == TOK_KEY_EVENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x669,
                    "gnode_t *parse_event_declaration(gravity_parser_t *, gtoken_t, gtoken_t)");
    }
    pcVar28 = "Event declarations not yet supported.";
    break;
  default:
    if (gVar24 == TOK_MACRO) {
      parse_macro_statement(parser);
      return (gnode_t *)0x0;
    }
    if (gVar24 == TOK_KEY_FUNC) {
      pgVar27 = parse_function(parser,true,access_specifier,storage_specifier);
      pgVar31 = get_enclosing(parser,NODE_FUNCTION_DECL);
      if (pgVar31 != (gnode_t *)0x0) {
        *(undefined1 *)((long)&pgVar27[1].token.value + 5) = 1;
        pgVar27 = local_store_declaration
                            (parser,*(char **)&pgVar27[1].token.colno,(char *)0x0,access_specifier,
                             storage_specifier,pgVar27);
        return pgVar27;
      }
      return pgVar27;
    }
    if (gVar24 == TOK_OP_SEMICOLON) {
      if (access_specifier != TOK_EOF || storage_specifier != TOK_EOF) {
        gravity_lexer_token(pgVar3);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x13dd63);
      }
      pgVar27 = parse_empty_statement(parser);
      return pgVar27;
    }
  case TOK_KEY_PRIVATE:
  case TOK_KEY_FILE:
  case TOK_KEY_INTERNAL:
  case TOK_KEY_PUBLIC:
  case TOK_KEY_STATIC:
  case TOK_KEY_EXTERN:
  case TOK_KEY_LAZY:
  case TOK_KEY_IMPORT:
  case TOK_KEY_CASE:
    gravity_lexer_token(pgVar3);
    pcVar28 = token_name(gVar24);
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x13dd94,pcVar28);
    return (gnode_t *)0x0;
  }
  report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar28);
  return (gnode_t *)0x0;
LAB_0010fde9:
  parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
  parse_semicolon(parser);
  if (iVar40 == 0) {
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x13df4e,pcVar28);
  }
  pgVar31 = get_enclosing(parser,NODE_FUNCTION_DECL);
  if (pgVar31 == (gnode_t *)0x0) {
    return pgVar27;
  }
  pcVar33 = (char *)0x0;
LAB_0010f884:
  pgVar27 = local_store_declaration
                      (parser,pcVar28,pcVar33,access_specifier,storage_specifier,pgVar27);
  return pgVar27;
}

Assistant:

static gnode_t *parse_declaration_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_declaration_statement");

    DECLARE_LEXER;
    gtoken_t peek = gravity_lexer_peek(lexer);
    gtoken_t access_specifier = 0;    // 0 means no access specifier set
    gtoken_t storage_specifier = 0;    // 0 means no storage specifier set

    // check if an access specifier is set
    if (token_isaccess_specifier(peek)) {
        access_specifier = gravity_lexer_next(lexer);
        peek = gravity_lexer_peek(lexer);
    }

    // check if a storage specifier is set
    if (token_isstorage_specifier(peek)) {
        storage_specifier = gravity_lexer_next(lexer);
        peek = gravity_lexer_peek(lexer);
    }

    // it is a syntax error to specify an access or storage specifier followed by an empty declaration
    if ((peek == TOK_OP_SEMICOLON) && ((access_specifier) || (storage_specifier))) {
        REPORT_ERROR(gravity_lexer_token(lexer), "Access or storage specifier cannot be used here.");
    }

    switch (peek) {
        case TOK_MACRO: return parse_macro_statement(parser);
        case TOK_KEY_FUNC: return parse_function_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_ENUM: return parse_enum_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_MODULE: return parse_module_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_EVENT: return parse_event_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_CLASS:
        case TOK_KEY_STRUCT: return parse_class_declaration(parser, access_specifier, storage_specifier);
        case TOK_OP_SEMICOLON: return parse_empty_statement(parser);
        case TOK_KEY_VAR:
        case TOK_KEY_CONST: return parse_variable_declaration(parser, true, access_specifier, storage_specifier);
        default: REPORT_ERROR(gravity_lexer_token(lexer), "Unrecognized token %s.", token_name(peek)); return NULL;
    }

    // should never reach this point
    assert(0);
    return NULL;
}